

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalEncoder::EncodeTraversalSymbols
          (MeshEdgebreakerTraversalEncoder *this)

{
  EdgebreakerTopologyBitPattern data;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  
  iVar2 = (*this->encoder_impl_->_vptr_MeshEdgebreakerEncoderImplInterface[10])();
  lVar4 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x70);
  EncoderBuffer::StartBitEncoding
            (&this->traversal_buffer_,
             (ulong)(*(long *)(lVar4 + 200) - *(long *)(lVar4 + 0xc0)) >> 2 & 0xffffffff,true);
  uVar3 = (int)((ulong)((long)(this->symbols_).
                              super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->symbols_).
                             super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
  if (-1 < (int)uVar3) {
    lVar4 = (ulong)uVar3 + 1;
    do {
      if (0 < (this->traversal_buffer_).bit_encoder_reserved_bytes_) {
        data = (this->symbols_).
               super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar4 + -1];
        EncoderBuffer::BitEncoder::PutBits
                  ((this->traversal_buffer_).bit_encoder_._M_t.
                   super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                   .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl,
                   data,*(int32_t *)(edge_breaker_topology_bit_pattern_length + (ulong)data * 4));
      }
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  EncoderBuffer::EndBitEncoding(&this->traversal_buffer_);
  return;
}

Assistant:

void EncodeTraversalSymbols() {
    // Bit encode the collected symbols.
    // Allocate enough storage for the bit encoder.
    // It's guaranteed that each face will need only up to 3 bits.
    traversal_buffer_.StartBitEncoding(
        encoder_impl_->GetEncoder()->mesh()->num_faces() * 3, true);
    for (int i = static_cast<int>(symbols_.size() - 1); i >= 0; --i) {
      traversal_buffer_.EncodeLeastSignificantBits32(
          edge_breaker_topology_bit_pattern_length[symbols_[i]], symbols_[i]);
    }
    traversal_buffer_.EndBitEncoding();
  }